

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendreCorrFuncZ.cpp
# Opt level: O1

void __thiscall
OpenMD::LegendreCorrFuncZ::validateSelection(LegendreCorrFuncZ *this,SelectionManager *param_1)

{
  StuntDouble *pSVar1;
  SelectionManager *this_00;
  int i;
  int local_24;
  
  this_00 = &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
             super_AutoCorrFunc<OpenMD::Vector3<double>_>.
             super_TimeCorrFunc<OpenMD::Vector3<double>_>.seleMan1_;
  pSVar1 = SelectionManager::beginSelected(this_00,&local_24);
  if (pSVar1 != (StuntDouble *)0x0) {
    do {
      if (1 < pSVar1->objType_ - otDAtom) {
        memcpy(&painCave,
               "LegendreCorrFuncZ::validateSelection Error: at least one of the selected objects is not Directional\n"
               ,0x65);
        painCave.isFatal = 1;
        simError();
      }
      pSVar1 = SelectionManager::nextSelected(this_00,&local_24);
    } while (pSVar1 != (StuntDouble *)0x0);
  }
  return;
}

Assistant:

void LegendreCorrFuncZ::validateSelection(SelectionManager&) {
    StuntDouble* sd;
    int i;
    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      if (!sd->isDirectional()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "LegendreCorrFuncZ::validateSelection Error: "
                 "at least one of the selected objects is not Directional\n");
        painCave.isFatal = 1;
        simError();
      }
    }
  }